

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall despot::TabularCPT::ComputeSparseChildDistribution(TabularCPT *this)

{
  pointer pvVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double extraout_XMM0_Qa;
  pair<int,_double> local_40;
  
  uVar2 = (*(this->super_CPT).super_Function._vptr_Function[7])();
  iVar3 = (*(this->super_CPT).super_Function._vptr_Function[9])(this);
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::resize(&this->sparse_values_,(long)(int)uVar2);
  uVar7 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    uVar5 = 0;
    while (iVar4 = (int)uVar5, iVar3 != iVar4) {
      (*(this->super_CPT).super_Function._vptr_Function[4])(this,uVar7 & 0xffffffff,uVar5);
      if (0.0 < extraout_XMM0_Qa) {
        pvVar1 = (this->sparse_values_).
                 super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (*(this->super_CPT).super_Function._vptr_Function[4])(this,uVar7 & 0xffffffff,uVar5);
        local_40.first = iVar4;
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<std::pair<int,double>>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   (pvVar1 + uVar7),&local_40);
      }
      uVar5 = (ulong)(iVar4 + 1);
    }
  }
  return;
}

Assistant:

void TabularCPT::ComputeSparseChildDistribution() {
	int parent_size = ParentSize(), child_size = ChildSize();
	sparse_values_.resize(parent_size);
	for (int p = 0; p < parent_size; p++) {
		for (int c = 0; c < child_size; c++) {
			if (GetValue(p, c) > 0)
				sparse_values_[p].push_back(
					pair<int, double>(c, GetValue(p, c)));
		}
	}
}